

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(unsigned_long_long lhs,
         SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  int iVar2;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> in_ESI;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> unaff_retaddr;
  unsigned_long_long ret;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  unsigned_long_long *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_14;
  int in_stack_fffffffffffffffc;
  
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_14);
  bVar1 = DivisionCornerCaseHelper<int,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase1
                    (CONCAT44(in_stack_fffffffffffffffc,in_ESI.m_int),unaff_retaddr,in_RDI);
  if ((!bVar1) &&
     (bVar1 = DivisionCornerCaseHelper2<int,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
              ::DivisionCornerCase2((unsigned_long_long)in_RDI,in_ESI,&local_14), !bVar1)) {
    iVar2 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    DivisionHelper<unsigned_long_long,_int,_1>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((unsigned_long_long *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
               (int *)in_stack_ffffffffffffffc8,(unsigned_long_long *)0x1c8cc8);
    SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_long_long>
              ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT44(iVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
    local_14.m_int = in_stack_fffffffffffffffc;
  }
  return (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_14.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}